

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall cppcms::application::application(application *this,service *srv)

{
  _data *v;
  _data *p_Var1;
  url_dispatcher *this_00;
  url_mapper *p;
  noncopyable *in_RDI;
  url_dispatcher *in_stack_ffffffffffffff98;
  hold_ptr<cppcms::url_dispatcher> *in_stack_ffffffffffffffa0;
  service *in_stack_ffffffffffffffa8;
  application *app;
  _data *in_stack_ffffffffffffffb0;
  url_mapper *in_stack_ffffffffffffffe0;
  
  booster::noncopyable::noncopyable(in_RDI);
  *(undefined ***)in_RDI = &PTR__application_0052b830;
  v = (_data *)operator_new(0x58);
  _data::_data(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  booster::hold_ptr<cppcms::application::_data>::hold_ptr
            ((hold_ptr<cppcms::application::_data> *)(in_RDI + 8),v);
  booster::atomic_counter::atomic_counter((atomic_counter *)(in_RDI + 0x20),0);
  *(noncopyable **)(in_RDI + 0x18) = in_RDI;
  *(noncopyable **)(in_RDI + 0x10) = in_RDI;
  p_Var1 = booster::hold_ptr<cppcms::application::_data>::operator->
                     ((hold_ptr<cppcms::application::_data> *)(in_RDI + 8));
  app = (application *)&p_Var1->url_disp;
  this_00 = (url_dispatcher *)operator_new(8);
  url_dispatcher::url_dispatcher(this_00,app);
  booster::hold_ptr<cppcms::url_dispatcher>::reset
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  p_Var1 = booster::hold_ptr<cppcms::application::_data>::operator->
                     ((hold_ptr<cppcms::application::_data> *)(in_RDI + 8));
  p = (url_mapper *)operator_new(8);
  url_mapper::url_mapper(in_stack_ffffffffffffffe0,(application *)v);
  booster::hold_ptr<cppcms::url_mapper>::reset((hold_ptr<cppcms::url_mapper> *)p_Var1,p);
  return;
}

Assistant:

application::application(cppcms::service &srv) :
	d(new _data(&srv)),
	refs_(0)
{
	parent_=root_=this;
	d->url_disp.reset(new url_dispatcher(this));
	d->url_map.reset(new url_mapper(this));
}